

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  undefined1 *puVar4;
  ssize_t sVar5;
  ulong uVar6;
  long lVar7;
  ssize_t sVar8;
  long *plVar9;
  int iVar10;
  long lVar11;
  msghdr h;
  sockaddr_storage peer;
  uv__mmsghdr msgs [20];
  iovec iov [20];
  sockaddr_in6 peers [20];
  uv_buf_t local_990;
  uint local_980;
  int local_97c;
  uv_buf_t local_978;
  msghdr local_968;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  uv__mmsghdr local_8a8 [20];
  long local_3a8;
  uint local_3a0 [78];
  undefined1 local_268 [568];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0xaf,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) != 0) {
    if (*(long *)&w[-1].fd == 0) {
      __assert_fail("handle->recv_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0xfe,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    lVar7._0_4_ = w[-1].pevents;
    lVar7._4_4_ = w[-1].events;
    if (lVar7 == 0) {
      __assert_fail("handle->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0xff,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    iVar10 = 0x20;
    local_980 = revents;
    while( true ) {
      local_990 = uv_buf_init((char *)0x0,0);
      (**(code **)&w[-1].pevents)(handle,0x10000,&local_990);
      if ((local_990.base == (char *)0x0) || (local_990.len == 0)) break;
      if (((*(byte *)((long)w[-1].pending_queue + 0xb) & 4) == 0) ||
         (uv_once(&once,uv__udp_mmsg_init), uv__recvmmsg_avail != '\x01')) {
        local_968.msg_control = (void *)0x0;
        local_968.msg_controllen = 0;
        local_968.msg_flags = 0;
        local_968._52_4_ = 0;
        local_928 = 0;
        uStack_920 = 0;
        local_918 = 0;
        uStack_910 = 0;
        local_908 = 0;
        uStack_900 = 0;
        local_8f8 = 0;
        uStack_8f0 = 0;
        local_8e8 = 0;
        uStack_8e0 = 0;
        local_8d8 = 0;
        uStack_8d0 = 0;
        local_8c8 = 0;
        uStack_8c0 = 0;
        local_8b8 = 0;
        uStack_8b0 = 0;
        local_968.msg_name = &local_928;
        local_968.msg_namelen = 0x80;
        local_968._12_4_ = 0;
        local_968.msg_iovlen = 1;
        local_968.msg_iov = (iovec *)&local_990;
        do {
          sVar5 = recvmsg(w->fd,&local_968,0);
          sVar8 = sVar5;
          if (sVar5 != -1) goto LAB_00256bd7;
          piVar3 = __errno_location();
          iVar1 = *piVar3;
        } while ((long)iVar1 == 4);
        if (iVar1 == 0xb) {
          sVar8 = 0;
        }
        else {
          sVar8 = -(long)iVar1;
        }
LAB_00256bd7:
        (**(code **)&w[-1].fd)(handle,sVar8,&local_990);
        iVar10 = iVar10 + -1;
      }
      else {
        uVar6 = local_990.len >> 0x10;
        if (0x13 < uVar6) {
          uVar6 = 0x14;
        }
        if (0xffff < local_990.len) {
          puVar4 = local_268;
          lVar7 = 0;
          pcVar2 = local_990.base;
          do {
            plVar9 = (long *)((long)local_3a0 + lVar7 + -8);
            *plVar9 = (long)pcVar2;
            *(undefined8 *)((long)local_3a0 + lVar7) = 0x10000;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iov + lVar7 * 4) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar7 * 4) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_name + lVar7 * 4) = 0;
            *(undefined8 *)(&local_8a8[0].msg_hdr.msg_namelen + lVar7) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_control + lVar7 * 4) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_controllen + lVar7 * 4) = 0;
            *(undefined8 *)(&local_8a8[0].msg_hdr.msg_flags + lVar7) = 0;
            *(long **)((long)&local_8a8[0].msg_hdr.msg_iov + lVar7 * 4) = plVar9;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar7 * 4) = 1;
            *(undefined1 **)((long)&local_8a8[0].msg_hdr.msg_name + lVar7 * 4) = puVar4;
            (&local_8a8[0].msg_hdr.msg_namelen)[lVar7] = 0x1c;
            (&local_8a8[0].msg_hdr.msg_flags)[lVar7] = 0;
            lVar7 = lVar7 + 0x10;
            puVar4 = puVar4 + 0x1c;
            pcVar2 = pcVar2 + 0x10000;
          } while (uVar6 << 4 != lVar7);
        }
        do {
          iVar1 = uv__recvmmsg(w->fd,local_8a8,(uint)uVar6);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
        sVar5 = (ssize_t)iVar1;
        if (iVar1 < 1) {
          if (iVar1 == 0) {
LAB_00256bf0:
            lVar7 = 0;
          }
          else {
            piVar3 = __errno_location();
            if ((long)*piVar3 == 0xb) goto LAB_00256bf0;
            lVar7 = -(long)*piVar3;
          }
          (**(code **)&w[-1].fd)(handle,lVar7,&local_990);
        }
        else {
          lVar11 = 0;
          lVar7 = sVar5;
          local_97c = iVar10;
          do {
            if (*(long *)&w[-1].fd == 0) break;
            local_978 = uv_buf_init(*(char **)((long)local_3a0 + lVar11 + -8),
                                    *(uint *)((long)local_3a0 + lVar11));
            (**(code **)&w[-1].fd)(handle,(&local_8a8[0].msg_len)[lVar11],&local_978);
            lVar11 = lVar11 + 0x10;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
          iVar10 = local_97c;
          revents = local_980;
          if (*(code **)&w[-1].fd != (code *)0x0) {
            (**(code **)&w[-1].fd)(handle,0,&local_990);
          }
        }
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        iVar10 = iVar10 - iVar1;
      }
      if ((((sVar5 == -1) || (iVar10 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
      goto LAB_00256c65;
    }
    (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_990,0,0);
  }
LAB_00256c65:
  if ((revents & 4) != 0) {
    uv__udp_sendmsg((uv_udp_t *)handle);
    uv__udp_run_completed((uv_udp_t *)handle);
  }
  return;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}